

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZShapeData.cpp
# Opt level: O1

void __thiscall TPZShapeData::Print(TPZShapeData *this,ostream *out)

{
  ostream *poVar1;
  long lVar2;
  long lVar3;
  string local_48;
  
  std::__ostream_insert<char,std::char_traits<char>>(out,"Shape function type ",0x14);
  ShapeFunctionType_abi_cxx11_(&local_48,this);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (out,(char *)CONCAT71(local_48._M_dataplus._M_p._1_7_,
                                           local_48._M_dataplus._M_p._0_1_),
                      local_48._M_string_length);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT71(local_48._M_dataplus._M_p._1_7_,local_48._M_dataplus._M_p._0_1_) !=
      &local_48.field_2) {
    operator_delete((undefined1 *)
                    CONCAT71(local_48._M_dataplus._M_p._1_7_,local_48._M_dataplus._M_p._0_1_),
                    local_48.field_2._M_allocated_capacity + 1);
  }
  TPZMatrix<double>::Print((TPZMatrix<double> *)&this->fPhi,"phi",out,EFormatted);
  TPZMatrix<double>::Print((TPZMatrix<double> *)&this->fDPhi,"dphi",out,EFormatted);
  std::__ostream_insert<char,std::char_traits<char>>(out,"fMasterDirections",0x11);
  poVar1 = ::operator<<(out,(TPZMatrix<double> *)&this->fMasterDirections);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  if ((this->fSDVecShapeIndex).super_TPZVec<std::pair<int,_long>_>.fNElements != 0) {
    std::__ostream_insert<char,std::char_traits<char>>(out,"VecShapeIndex: ",0xf);
    if (0 < (this->fSDVecShapeIndex).super_TPZVec<std::pair<int,_long>_>.fNElements) {
      lVar2 = 0;
      lVar3 = 0;
      do {
        poVar1 = (ostream *)
                 std::ostream::operator<<
                           (out,*(int *)((long)&((this->fSDVecShapeIndex).
                                                 super_TPZVec<std::pair<int,_long>_>.fStore)->first
                                        + lVar2));
        local_48._M_dataplus._M_p._0_1_ = 0x2f;
        poVar1 = std::__ostream_insert<char,std::char_traits<char>>(poVar1,(char *)&local_48,1);
        poVar1 = std::ostream::_M_insert<long>((long)poVar1);
        local_48._M_dataplus._M_p._0_1_ = 0x20;
        std::__ostream_insert<char,std::char_traits<char>>(poVar1,(char *)&local_48,1);
        lVar3 = lVar3 + 1;
        lVar2 = lVar2 + 0x10;
      } while (lVar3 < (this->fSDVecShapeIndex).super_TPZVec<std::pair<int,_long>_>.fNElements);
    }
    local_48._M_dataplus._M_p._0_1_ = 10;
    std::__ostream_insert<char,std::char_traits<char>>(out,(char *)&local_48,1);
  }
  return;
}

Assistant:

void TPZShapeData::Print(std::ostream &out) const
{
    out << "Shape function type " << ShapeFunctionType() << std::endl;
    fPhi.Print("phi",out);
    fDPhi.Print("dphi",out);
    out << "fMasterDirections" << fMasterDirections << std::endl;
    if (fSDVecShapeIndex.size()) {
        out << "VecShapeIndex: ";
        for (int64_t i = 0; i < fSDVecShapeIndex.size(); i++) {
            out << fSDVecShapeIndex[i].first << '/' << fSDVecShapeIndex[i].second << ' ';
        }
        out << '\n';
    }
}